

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  string *key;
  pointer ppcVar1;
  cmCursesCacheEntryComposite *pcVar2;
  __type _Var3;
  int iVar4;
  CacheEntryType type;
  char *__s;
  undefined4 extraout_var;
  cmState *pcVar5;
  pointer ppcVar6;
  allocator<char> local_d9;
  string fixedNewValue;
  string fixedOldValue;
  string oldValue;
  string local_70;
  string newValue;
  
  ppcVar1 = (this->Entries->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->Entries->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
      ppcVar6 = ppcVar6 + 1) {
    pcVar2 = *ppcVar6;
    key = &pcVar2->Key;
    __s = cmState::GetCacheEntryValue(this->CMakeInstance->State,key);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&oldValue,__s,(allocator<char> *)&newValue);
      iVar4 = (*pcVar2->Entry->_vptr_cmCursesWidget[5])();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&newValue,(char *)CONCAT44(extraout_var,iVar4),
                 (allocator<char> *)&fixedOldValue);
      fixedOldValue._M_dataplus._M_p = (pointer)&fixedOldValue.field_2;
      fixedOldValue._M_string_length = 0;
      fixedNewValue._M_dataplus._M_p = (pointer)&fixedNewValue.field_2;
      fixedNewValue._M_string_length = 0;
      fixedOldValue.field_2._M_local_buf[0] = '\0';
      fixedNewValue.field_2._M_local_buf[0] = '\0';
      pcVar5 = this->CMakeInstance->State;
      type = cmState::GetCacheEntryType(pcVar5,key);
      FixValue((cmCursesMainForm *)pcVar5,type,&oldValue,&fixedOldValue);
      FixValue((cmCursesMainForm *)pcVar5,type,&newValue,&fixedNewValue);
      _Var3 = std::operator==(&fixedOldValue,&fixedNewValue);
      if (!_Var3) {
        pcVar5 = this->CMakeInstance->State;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"MODIFIED",&local_d9)
        ;
        cmState::SetCacheEntryBoolProperty(pcVar5,key,&local_70,true);
        std::__cxx11::string::~string((string *)&local_70);
        cmState::SetCacheEntryValue(this->CMakeInstance->State,key,&fixedNewValue);
      }
      std::__cxx11::string::~string((string *)&fixedNewValue);
      std::__cxx11::string::~string((string *)&fixedOldValue);
      std::__cxx11::string::~string((string *)&newValue);
      std::__cxx11::string::~string((string *)&oldValue);
    }
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  for (cmCursesCacheEntryComposite* entry : *this->Entries) {
    const std::string& cacheKey = entry->Key;
    const char* existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(cacheKey);
    if (existingValue) {
      std::string oldValue = existingValue;
      std::string newValue = entry->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmStateEnums::CacheEntryType t =
        this->CMakeInstance->GetState()->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if (!(fixedOldValue == fixedNewValue)) {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()->SetCacheEntryBoolProperty(
          cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()->SetCacheEntryValue(cacheKey,
                                                            fixedNewValue);
      }
    }
  }
}